

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_postfix_t::Generate(ast_postfix_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  int pc_local;
  ostream *output_local;
  ast_postfix_t *this_local;
  
  if (this->arglist == (ast_arg_list_t *)0x0) {
    poVar2 = std::operator<<(output,"call ");
    poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
    poVar2 = std::operator<<(poVar2,"\nresl");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = pc + 2;
  }
  else {
    iVar1 = ast_arg_list_t::Generate(this->arglist,output,pc);
    poVar2 = std::operator<<(output,"call ");
    poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
    poVar2 = std::operator<<(poVar2,"\ndrop ");
    sVar3 = ast_arg_list_t::Total(this->arglist);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,"\nresl");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = iVar1 + 3;
  }
  return this_local._4_4_;
}

Assistant:

int ast_postfix_t::Generate(std::ostream& output, int pc) const {
    if (arglist == nullptr) {
      output << "call " << this->identifier << "\nresl" << std::endl;
      return pc + 2;
    }
    else
    {
      pc = arglist->Generate(output, pc);
      output << "call " << this->identifier << "\ndrop " << arglist->Total() << "\nresl" << std::endl;
      return pc + 3;
    }
  }